

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

void __thiscall nv::Kernel2::initSobel(Kernel2 *this)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  
  switch(this->m_windowSize) {
  case 3:
    pfVar2 = this->m_data;
    pfVar2[0] = -1.0;
    pfVar2[1] = 0.0;
    pfVar2[2] = 1.0;
    pfVar2[3] = -2.0;
    pfVar2[4] = 0.0;
    pfVar2[5] = 2.0;
    pfVar2[6] = -1.0;
    pfVar2[7] = 0.0;
    pfVar2[8] = 1.0;
    break;
  case 5:
    pfVar2 = (float *)&DAT_001f8d20;
    pfVar3 = this->m_data;
    for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pfVar3 = *pfVar2;
      pfVar2 = pfVar2 + 1;
      pfVar3 = pfVar3 + 1;
    }
    return;
  case 7:
    memcpy(this->m_data,&DAT_001f8c50,0xc4);
    return;
  case 9:
    memcpy(this->m_data,&DAT_001f8b00,0x144);
    return;
  }
  return;
}

Assistant:

void Kernel2::initSobel()
{
	if (m_windowSize == 3)
	{
		m_data[0] = -1; m_data[1] = 0; m_data[2] = 1;
		m_data[3] = -2; m_data[4] = 0; m_data[5] = 2;
		m_data[6] = -1; m_data[7] = 0; m_data[8] = 1;
	}
	else if (m_windowSize == 5)
	{
		float elements[] = {
            -1, -2, 0, 2, 1,
            -2, -3, 0, 3, 2,
            -3, -4, 0, 4, 3,
            -2, -3, 0, 3, 2,
            -1, -2, 0, 2, 1
		};

		for (int i = 0; i < 5*5; i++) {
			m_data[i] = elements[i];
		}
	}
	else if (m_windowSize == 7)
	{
		float elements[] = {
            -1, -2, -3, 0, 3, 2, 1,
            -2, -3, -4, 0, 4, 3, 2,
            -3, -4, -5, 0, 5, 4, 3,
            -4, -5, -6, 0, 6, 5, 4,
            -3, -4, -5, 0, 5, 4, 3,
            -2, -3, -4, 0, 4, 3, 2,
            -1, -2, -3, 0, 3, 2, 1
		};

		for (int i = 0; i < 7*7; i++) {
			m_data[i] = elements[i];
		}
	}
	else if (m_windowSize == 9)
	{
		float elements[] = {
            -1, -2, -3, -4, 0, 4, 3, 2, 1,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -5, -6, -7, -8, 0, 8, 7, 6, 5,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -1, -2, -3, -4, 0, 4, 3, 2, 1
		};
		
		for (int i = 0; i < 9*9; i++) {
			m_data[i] = elements[i];
		}
	}
}